

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::t_cpp_generator
          (t_cpp_generator *this,t_program *program,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *parsed_options,string *option_string)

{
  _Rb_tree_node_base *__rhs;
  bool bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  
  t_oop_generator::t_oop_generator(&this->super_t_oop_generator,program);
  (this->super_t_oop_generator).super_t_generator._vptr_t_generator =
       (_func_int **)&PTR__t_cpp_generator_00366488;
  (this->ns_open_)._M_dataplus._M_p = (pointer)&(this->ns_open_).field_2;
  (this->ns_open_)._M_string_length = 0;
  (this->ns_open_).field_2._M_local_buf[0] = '\0';
  (this->ns_close_)._M_dataplus._M_p = (pointer)&(this->ns_close_).field_2;
  (this->ns_close_)._M_string_length = 0;
  (this->ns_close_).field_2._M_local_buf[0] = '\0';
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_types_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_types_impl_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_types_tcc_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_header_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_service_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_service_tcc_);
  this->gen_no_client_completion_ = false;
  this->gen_no_default_operators_ = false;
  this->gen_no_skeleton_ = false;
  this->has_members_ = false;
  this->gen_pure_enums_ = false;
  this->gen_templates_ = false;
  this->gen_templates_only_ = false;
  this->gen_moveable_ = false;
  this->gen_no_ostream_operators_ = false;
  this->use_include_prefix_ = false;
  this->gen_cob_style_ = false;
  this->gen_no_client_completion_ = false;
  p_Var3 = (parsed_options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(parsed_options->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::assign
                ((char *)&(this->super_t_oop_generator).super_t_generator.out_dir_base_);
      return;
    }
    __rhs = p_Var3 + 1;
    iVar2 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar2 == 0) {
      this->gen_pure_enums_ = true;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        this->use_include_prefix_ = true;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar2 == 0) {
          this->gen_cob_style_ = true;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar2 == 0) {
            this->gen_no_client_completion_ = true;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar2 == 0) {
              this->gen_no_default_operators_ = true;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)__rhs);
              if (iVar2 == 0) {
                this->gen_templates_ = true;
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(p_Var3 + 2),"only");
                this->gen_templates_only_ = bVar1;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)__rhs);
                if (iVar2 == 0) {
                  this->gen_moveable_ = true;
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)__rhs);
                  if (iVar2 == 0) {
                    this->gen_no_ostream_operators_ = true;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)__rhs);
                    if (iVar2 != 0) {
                      __return_storage_ptr__ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __cxa_allocate_exception(0x20);
                      std::operator+(__return_storage_ptr__,"unknown option cpp:",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__rhs);
                      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                                  std::__cxx11::string::~string);
                    }
                    this->gen_no_skeleton_ = true;
                  }
                }
              }
            }
          }
        }
      }
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

t_cpp_generator(t_program* program,
                  const std::map<std::string, std::string>& parsed_options,
                  const std::string& option_string)
    : t_oop_generator(program) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;


    gen_pure_enums_ = false;
    use_include_prefix_ = false;
    gen_cob_style_ = false;
    gen_no_client_completion_ = false;
    gen_no_default_operators_ = false;
    gen_templates_ = false;
    gen_templates_only_ = false;
    gen_moveable_ = false;
    gen_no_ostream_operators_ = false;
    gen_no_skeleton_ = false;
    has_members_ = false;

    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("pure_enums") == 0) {
        gen_pure_enums_ = true;
      } else if( iter->first.compare("include_prefix") == 0) {
        use_include_prefix_ = true;
      } else if( iter->first.compare("cob_style") == 0) {
        gen_cob_style_ = true;
      } else if( iter->first.compare("no_client_completion") == 0) {
        gen_no_client_completion_ = true;
      } else if( iter->first.compare("no_default_operators") == 0) {
        gen_no_default_operators_ = true;
      } else if( iter->first.compare("templates") == 0) {
        gen_templates_ = true;
        gen_templates_only_ = (iter->second == "only");
      } else if( iter->first.compare("moveable_types") == 0) {
        gen_moveable_ = true;
      } else if ( iter->first.compare("no_ostream_operators") == 0) {
        gen_no_ostream_operators_ = true;
      } else if ( iter->first.compare("no_skeleton") == 0) {
        gen_no_skeleton_ = true;
      } else {
        throw "unknown option cpp:" + iter->first;
      }
    }

    out_dir_base_ = "gen-cpp";
  }